

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

int Abc_TruthNpnCountUnique(Abc_TtStore_t *p)

{
  int nTableSize_00;
  int Key_00;
  int iVar1;
  int *pTable_00;
  int *pNexts_00;
  int local_30;
  int Key;
  int k;
  int i;
  int *pNexts;
  int *pTable;
  int nTableSize;
  Abc_TtStore_t *p_local;
  
  nTableSize_00 = Abc_PrimeCudd(p->nFuncs);
  pTable_00 = (int *)malloc((long)nTableSize_00 << 2);
  memset(pTable_00,0xff,(long)nTableSize_00 << 2);
  pNexts_00 = (int *)malloc((long)nTableSize_00 << 2);
  memset(pNexts_00,0xff,(long)nTableSize_00 << 2);
  for (Key = 0; Key < p->nFuncs; Key = Key + 1) {
    Key_00 = Abc_TruthHashKey(p->pFuncs[Key],p->nWords,nTableSize_00);
    iVar1 = Abc_TruthHashLookup(p->pFuncs,Key,p->nWords,pTable_00,pNexts_00,Key_00);
    if (iVar1 == 0) {
      pNexts_00[Key] = pTable_00[Key_00];
      pTable_00[Key_00] = Key;
    }
    else {
      p->pFuncs[Key] = (word *)0x0;
    }
  }
  if (pTable_00 != (int *)0x0) {
    free(pTable_00);
  }
  if (pNexts_00 != (int *)0x0) {
    free(pNexts_00);
  }
  if (*p->pFuncs == (word *)0x0) {
    __assert_fail("p->pFuncs[0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcNpn.c"
                  ,0x6d,"int Abc_TruthNpnCountUnique(Abc_TtStore_t *)");
  }
  local_30 = 1;
  for (Key = 1; Key < p->nFuncs; Key = Key + 1) {
    if (p->pFuncs[Key] != (word *)0x0) {
      p->pFuncs[local_30] = p->pFuncs[Key];
      local_30 = local_30 + 1;
    }
  }
  p->nFuncs = local_30;
  return local_30;
}

Assistant:

int Abc_TruthNpnCountUnique( Abc_TtStore_t * p )
{
    // allocate hash table
    int nTableSize = Abc_PrimeCudd(p->nFuncs);
    int * pTable = ABC_FALLOC( int, nTableSize );
    int * pNexts = ABC_FALLOC( int, nTableSize );
    // hash functions
    int i, k, Key;
    for ( i = 0; i < p->nFuncs; i++ )
    {
        Key = Abc_TruthHashKey( p->pFuncs[i], p->nWords, nTableSize );
        if ( Abc_TruthHashLookup( p->pFuncs, i, p->nWords, pTable, pNexts, Key ) ) // found equal
            p->pFuncs[i] = NULL;
        else // there is no equal (the first time this one occurs so far)
            pNexts[i] = pTable[Key], pTable[Key] = i;
    }
    ABC_FREE( pTable );
    ABC_FREE( pNexts );
    // count the number of unqiue functions
    assert( p->pFuncs[0] != NULL );
    for ( i = k = 1; i < p->nFuncs; i++ )
        if ( p->pFuncs[i] != NULL )
            p->pFuncs[k++] = p->pFuncs[i];
    return (p->nFuncs = k);
}